

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode UA_Server_delayedCallback(UA_Server *server,UA_ServerCallback callback,void *data)

{
  UA_StatusCode UVar1;
  UA_DelayedJob *pUVar2;
  
  pUVar2 = (UA_DelayedJob *)malloc(0x28);
  if (pUVar2 == (UA_DelayedJob *)0x0) {
    UVar1 = 0x80030000;
  }
  else {
    (pUVar2->job).type = UA_JOBTYPE_METHODCALL;
    (pUVar2->job).job.methodCall.data = data;
    (pUVar2->job).job.methodCall.method = callback;
    (pUVar2->next).sle_next = (server->delayedCallbacks).slh_first;
    (server->delayedCallbacks).slh_first = pUVar2;
    UVar1 = 0;
  }
  return UVar1;
}

Assistant:

UA_StatusCode
UA_Server_delayedCallback(UA_Server *server, UA_ServerCallback callback, void *data) {
    UA_DelayedJob *dj = UA_malloc(sizeof(UA_DelayedJob));
    if(!dj)
        return UA_STATUSCODE_BADOUTOFMEMORY;
    dj->job.type = UA_JOBTYPE_METHODCALL;
    dj->job.job.methodCall.data = data;
    dj->job.job.methodCall.method = callback;
    SLIST_INSERT_HEAD(&server->delayedCallbacks, dj, next);
    return UA_STATUSCODE_GOOD;
}